

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_str_offsets.c
# Opt level: O2

int dwarf_str_offsets_value_by_index
              (Dwarf_Str_Offsets_Table sot,Dwarf_Unsigned index,Dwarf_Unsigned *stroffset,
              Dwarf_Error *error)

{
  ulong uVar1;
  ulong uVar2;
  Dwarf_Signed errval;
  ulong uVar3;
  Dwarf_Debug dbg;
  Dwarf_Unsigned _ltmp;
  
  if (sot == (Dwarf_Str_Offsets_Table)0x0) {
    errval = 0x192;
  }
  else {
    dbg = sot->so_dbg;
    if (dbg != (Dwarf_Debug)0x0) {
      if (sot->so_magic_value == 0x2feed2) {
        if (sot->so_array_entry_count <= index) {
          return -1;
        }
        uVar1 = (dbg->de_debug_str_offsets).dss_size;
        uVar2 = (ulong)sot->so_array_entry_size;
        uVar3 = index * uVar2 + sot->so_lcl_offset_to_array + sot->so_table_start_offset;
        if (uVar1 < uVar3 || uVar1 < uVar3 + uVar2) {
          _dwarf_error_string(dbg,error,0x197,
                              "DW_DLE_STR_OFFSETS_ARRAY_INDEX_WRONG: A libdwarf internal bug. Report to the maintainers"
                             );
          return 1;
        }
        _ltmp = 0;
        (*dbg->de_copy_word)(&_ltmp,sot->so_section_start_ptr + uVar3,uVar2);
        *stroffset = _ltmp;
        return 0;
      }
      errval = 0x194;
      goto LAB_001d58e6;
    }
    errval = 0x193;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_001d58e6:
  _dwarf_error(dbg,error,errval);
  return 1;
}

Assistant:

int
dwarf_str_offsets_value_by_index(Dwarf_Str_Offsets_Table sot,
    Dwarf_Unsigned index,
    Dwarf_Unsigned *stroffset,
    Dwarf_Error *error)
{
    Dwarf_Small *entryptr = 0;
    Dwarf_Unsigned val = 0;
    Dwarf_Unsigned entryoffset = 0;
    Dwarf_Unsigned secsize = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Small *end_ptr = 0;
/* so_section_size */

    VALIDATE_SOT(sot)
    dbg = sot->so_dbg;
    secsize = dbg->de_debug_str_offsets.dss_size;
    if (index >= sot->so_array_entry_count) {
        return DW_DLV_NO_ENTRY;
    }
    entryoffset = sot->so_table_start_offset +
        sot->so_lcl_offset_to_array;
    entryoffset += index*sot->so_array_entry_size;
    entryptr = sot->so_section_start_ptr + entryoffset;
    if (entryoffset > secsize ||
        (entryoffset+sot->so_array_entry_size) > secsize) {
        _dwarf_error_string(dbg,error,
            DW_DLE_STR_OFFSETS_ARRAY_INDEX_WRONG,
            "DW_DLE_STR_OFFSETS_ARRAY_INDEX_WRONG: "
            "A libdwarf internal bug. Report to the maintainers");
        return DW_DLV_ERROR;
    }
    end_ptr = entryptr+sot->so_array_entry_size;
    READ_UNALIGNED_CK(dbg, val, Dwarf_Unsigned,
        entryptr, sot->so_array_entry_size,error,end_ptr);
    *stroffset = val;
    return DW_DLV_OK;
}